

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

float testinator::detail::Arbitrary_Arithmetic_Real<float>::generate
                (size_t generation,unsigned_long randomSeed)

{
  TestRegistry *this;
  float __a;
  float __b;
  uniform_real_distribution<float> local_30;
  uniform_real_distribution<float> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  switch(generation) {
  case 0:
    generation_local._4_4_ = 0.0;
    break;
  case 1:
    generation_local._4_4_ = ::std::numeric_limits<float>::min();
    break;
  case 2:
    generation_local._4_4_ = ::std::numeric_limits<float>::max();
    break;
  case 3:
    generation_local._4_4_ = ::std::numeric_limits<float>::lowest();
    break;
  default:
    this = GetTestRegistry();
    dis._M_param = (param_type)TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)dis._M_param,randomSeed);
    __a = ::std::numeric_limits<float>::min();
    __b = ::std::numeric_limits<float>::max();
    ::std::uniform_real_distribution<float>::uniform_real_distribution(&local_30,__a,__b);
    generation_local._4_4_ =
         ::std::uniform_real_distribution<float>::operator()
                   (&local_30,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)dis._M_param);
  }
  return generation_local._4_4_;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();
          case 3:
            return std::numeric_limits<T>::lowest();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_real_distribution<T> dis(
                std::numeric_limits<T>::min(), std::numeric_limits<T>::max());
            return dis(gen);
          }
        }
      }